

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.cpp
# Opt level: O1

int __thiscall rsg::VariableType::getScalarSize(VariableType *this)

{
  Type TVar1;
  pointer pMVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pMVar6;
  
  iVar5 = 1;
  for (; TVar1 = this->m_baseType, TVar1 == TYPE_ARRAY; this = this->m_elementType) {
    iVar5 = iVar5 * this->m_numElements;
  }
  if (TVar1 < TYPE_LAST) {
    if ((0xcfU >> (TVar1 & 0x1f) & 1) != 0) {
      iVar4 = this->m_numElements;
      goto LAB_0013a621;
    }
    if (TVar1 == TYPE_STRUCT) {
      pMVar6 = (this->m_members).
               super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar2 = (this->m_members).
               super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pMVar6 != pMVar2) {
        iVar4 = 0;
        do {
          iVar3 = getScalarSize(pMVar6->m_type);
          iVar4 = iVar4 + iVar3;
          pMVar6 = pMVar6 + 1;
        } while (pMVar6 != pMVar2);
        goto LAB_0013a621;
      }
    }
  }
  iVar4 = 0;
LAB_0013a621:
  return iVar4 * iVar5;
}

Assistant:

int VariableType::getScalarSize (void) const
{
	switch (m_baseType)
	{
		case TYPE_VOID:
		case TYPE_FLOAT:
		case TYPE_INT:
		case TYPE_BOOL:
		case TYPE_SAMPLER_2D:
		case TYPE_SAMPLER_CUBE:
			return m_numElements;

		case TYPE_STRUCT:
		{
			int sum = 0;
			for (vector<Member>::const_iterator i = m_members.begin(); i != m_members.end(); i++)
				sum += i->getType().getScalarSize();
			return sum;
		}

		case TYPE_ARRAY:
		{
			DE_ASSERT(m_elementType);
			return m_elementType->getScalarSize() * m_numElements;
		}

		default:
			DE_ASSERT(false);
			return 0;
	}
}